

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

void __thiscall testing::internal::UnitTestImpl::~UnitTestImpl(UnitTestImpl *this)

{
  pointer ppTVar1;
  pointer ppEVar2;
  DeathTestFactory *pDVar3;
  pointer piVar4;
  pointer pcVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  pointer ppTVar7;
  pointer ppEVar8;
  
  this->_vptr_UnitTestImpl = (_func_int **)&PTR__UnitTestImpl_001e7e60;
  ppTVar1 = (this->test_cases_).
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppTVar7 = (this->test_cases_).
                 super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppTVar7 != ppTVar1; ppTVar7 = ppTVar7 + 1
      ) {
    if (*ppTVar7 != (TestCase *)0x0) {
      (*(*ppTVar7)->_vptr_TestCase[1])();
    }
  }
  ppEVar2 = (this->environments_).
            super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar8 = (this->environments_).
                 super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppEVar8 != ppEVar2;
      ppEVar8 = ppEVar8 + 1) {
    if (*ppEVar8 != (Environment *)0x0) {
      (**(code **)(*(long *)*ppEVar8 + 8))();
    }
  }
  if (this->os_stack_trace_getter_ != (OsStackTraceGetterInterface *)0x0) {
    (*this->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface[1])();
  }
  ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
  ::~ThreadLocal(&this->gtest_trace_stack_);
  pDVar3 = (this->death_test_factory_).ptr_;
  if (pDVar3 != (DeathTestFactory *)0x0) {
    (*pDVar3->_vptr_DeathTestFactory[1])();
    (this->death_test_factory_).ptr_ = (DeathTestFactory *)0x0;
  }
  scoped_ptr<testing::internal::InternalRunDeathTestFlag>::reset
            (&this->internal_run_death_test_flag_,(InternalRunDeathTestFlag *)0x0);
  TestEventListeners::~TestEventListeners(&this->listeners_);
  TestResult::~TestResult(&this->ad_hoc_test_result_);
  ParameterizedTestCaseRegistry::~ParameterizedTestCaseRegistry(&this->parameterized_test_registry_)
  ;
  piVar4 = (this->test_case_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar4 != (pointer)0x0) {
    operator_delete(piVar4,(long)(this->test_case_indices_).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar4);
  }
  ppTVar7 = (this->test_cases_).
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar7 != (pointer)0x0) {
    operator_delete(ppTVar7,(long)(this->test_cases_).
                                  super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar7
                   );
  }
  ppEVar8 = (this->environments_).
            super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppEVar8 != (pointer)0x0) {
    operator_delete(ppEVar8,(long)(this->environments_).
                                  super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppEVar8
                   );
  }
  ThreadLocal<testing::TestPartResultReporterInterface_*>::~ThreadLocal
            (&this->per_thread_test_part_result_reporter_);
  Mutex::~Mutex(&this->global_test_part_result_reporter_mutex_);
  pcVar5 = (this->original_working_dir_).pathname_._M_dataplus._M_p;
  paVar6 = &(this->original_working_dir_).pathname_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar6) {
    operator_delete(pcVar5,paVar6->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

UnitTestImpl::~UnitTestImpl() {
  // Deletes every TestCase.
  ForEach(test_cases_, internal::Delete<TestCase>);

  // Deletes every Environment.
  ForEach(environments_, internal::Delete<Environment>);

  delete os_stack_trace_getter_;
}